

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int parser_setup_from_fmt_ap(fy_parser *fyp,void *user)

{
  int iVar1;
  int iVar2;
  char *__s;
  char *buf;
  int sizew;
  int size;
  va_list ap_orig;
  undefined8 uStack_48;
  va_list ap;
  fy_document_vbuildf_ctx *vctx;
  void *user_local;
  fy_parser *fyp_local;
  
  ap_orig[0].overflow_arg_area = *(void **)((long)user + 0x18);
  _sizew = *(undefined8 *)((long)user + 8);
  ap_orig[0]._0_8_ = *(undefined8 *)((long)user + 0x10);
  iVar1 = vsnprintf((char *)0x0,0,*user,&sizew);
  if (iVar1 < 0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0xba8,"parser_setup_from_fmt_ap","vsnprintf() failed");
  }
  else {
    __s = (char *)malloc((long)(iVar1 + 1));
    if (__s == (char *)0x0) {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0xbac,"parser_setup_from_fmt_ap","malloc() failed");
    }
    else {
      ap[0].overflow_arg_area = *(void **)((long)user + 0x18);
      uStack_48 = *(undefined8 *)((long)user + 8);
      ap[0]._0_8_ = *(undefined8 *)((long)user + 0x10);
      iVar2 = vsnprintf(__s,(long)(iVar1 + 1),*user,&uStack_48);
      if (iVar2 == iVar1) {
        __s[iVar1] = '\0';
        iVar1 = fy_parser_set_malloc_string(fyp,__s,(long)iVar1);
        return iVar1;
      }
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0xbb1,"parser_setup_from_fmt_ap","vsnprintf() failed");
    }
  }
  return -1;
}

Assistant:

static int parser_setup_from_fmt_ap(struct fy_parser *fyp, void *user) {
    struct fy_document_vbuildf_ctx *vctx = user;
    va_list ap, ap_orig;
    int size, sizew;
    char *buf;

    /* first try without allocating */
    va_copy(ap_orig, vctx->ap);
    size = vsnprintf(NULL, 0, vctx->fmt, ap_orig);
    va_end(ap_orig);

    fyp_error_check(fyp, size >= 0, err_out,
                    "vsnprintf() failed");

    buf = malloc(size + 1);
    fyp_error_check(fyp, buf, err_out,
                    "malloc() failed");

    va_copy(ap, vctx->ap);
    sizew = vsnprintf(buf, size + 1, vctx->fmt, ap);
    fyp_error_check(fyp, sizew == size, err_out,
                    "vsnprintf() failed");
    va_end(ap);

    buf[size] = '\0';

    return fy_parser_set_malloc_string(fyp, buf, size);

    err_out:
    return -1;
}